

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::InitializeWithPolicy
          (ThreadSafeArena *this,AllocationPolicy *policy)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  _func_void_void_ptr_size_t *p_Var4;
  bool bVar5;
  Nonnull<const_char_*> failure_msg;
  ulong uVar6;
  int line;
  LogMessage local_38;
  void *p;
  undefined8 local_20;
  
  Init(this);
  bVar5 = AllocationPolicy::IsDefault(policy);
  if (!bVar5) {
    uVar1 = (this->alloc_policy_).policy_;
    bVar5 = SerialArena::MaybeAllocateAligned(&this->first_arena_,0x20,&p);
    if (!bVar5) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                 ,0x27d);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_38,(char (*) [39])"MaybeAllocateAligned cannot fail here.");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    sVar2 = policy->start_block_size;
    sVar3 = policy->max_block_size;
    p_Var4 = policy->block_dealloc;
    *(_func_void_ptr_size_t **)((long)p + 0x10) = policy->block_alloc;
    *(_func_void_void_ptr_size_t **)((long)p + 0x18) = p_Var4;
    *(size_t *)p = sVar2;
    *(size_t *)((long)p + 8) = sVar3;
    local_20 = (ulong)local_20._4_4_ << 0x20;
    local_38._0_8_ = ZEXT48((uint)p & 3);
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_long>
                            ((uint *)&local_20,(unsigned_long *)&local_38,
                             "0u == reinterpret_cast<uintptr_t>(p) & 3");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0x282;
LAB_0011d65c:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                 ,line,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    uVar6 = (ulong)((uint)(this->alloc_policy_).policy_ & 7) | (ulong)p;
    (this->alloc_policy_).policy_ = uVar6;
    if (3 < uVar1) {
      local_38._0_8_ = ZEXT48((uint)uVar1 & 3);
      local_20 = (ulong)((uint)uVar6 & 3);
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                              ((unsigned_long *)&local_38,&local_20,
                               "old_alloc_policy & 3 == alloc_policy_.get_raw() & 3");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        line = 0x284;
        goto LAB_0011d65c;
      }
    }
  }
  return;
}

Assistant:

void ThreadSafeArena::InitializeWithPolicy(const AllocationPolicy& policy) {
  Init();

  if (policy.IsDefault()) return;

#ifndef NDEBUG
  const uint64_t old_alloc_policy = alloc_policy_.get_raw();
  // If there was a policy (e.g., in Reset()), make sure flags were preserved.
#define ABSL_DCHECK_POLICY_FLAGS_() \
  if (old_alloc_policy > 3)         \
  ABSL_CHECK_EQ(old_alloc_policy & 3, alloc_policy_.get_raw() & 3)
#else
#define ABSL_DCHECK_POLICY_FLAGS_()
#endif  // NDEBUG

  // We ensured enough space so this cannot fail.
  void* p;
  if (!first_arena_.MaybeAllocateAligned(kAllocPolicySize, &p)) {
    ABSL_LOG(FATAL) << "MaybeAllocateAligned cannot fail here.";
    return;
  }
  new (p) AllocationPolicy{policy};
  // Low bits store flags, so they mustn't be overwritten.
  ABSL_DCHECK_EQ(0u, reinterpret_cast<uintptr_t>(p) & 3);
  alloc_policy_.set_policy(reinterpret_cast<AllocationPolicy*>(p));
  ABSL_DCHECK_POLICY_FLAGS_();

#undef ABSL_DCHECK_POLICY_FLAGS_
}